

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Journal.cc
# Opt level: O1

void __thiscall JournalOperation::status(JournalOperation *this)

{
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  long *plVar3;
  
  poVar1 = sdglib::OutputLog(false);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Operation: ",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," applied on ",0xc);
  __s = ctime(&this->timestamp);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  poVar1 = sdglib::OutputLog(false);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Tool: ",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->tool)._M_dataplus._M_p,(this->tool)._M_string_length);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = sdglib::OutputLog(false);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Details: ",9);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->detail)._M_dataplus._M_p,(this->detail)._M_string_length);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void JournalOperation::status() const {
    sdglib::OutputLog(false) << "Operation: " << name << " applied on " << ctime(&timestamp);
    sdglib::OutputLog(false) << "Tool: " << tool << std::endl;
    sdglib::OutputLog(false) << "Details: " << detail << std::endl << std::endl;
}